

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

void cleanup_curse(void)

{
  long lVar1;
  void *p;
  ulong uVar2;
  
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < z_info->curse_max; uVar2 = uVar2 + 1) {
    string_free(*(char **)(curses->conflict_flags + lVar1 + -0x20));
    string_free(*(char **)(curses->conflict_flags + lVar1 + -8));
    mem_free(*(void **)(curses->conflict_flags + lVar1 + 8));
    if (*(long *)(curses->conflict_flags + lVar1 + -0x10) != 0) {
      free_effect(*(effect **)(*(long *)(curses->conflict_flags + lVar1 + -0x10) + 0xf0));
      mem_free(*(void **)(*(long *)(curses->conflict_flags + lVar1 + -0x10) + 0xf8));
      p = *(void **)(curses->conflict_flags + lVar1 + -0x10);
      if (*(object **)((long)p + 0x28) != (object *)0x0) {
        object_free(*(object **)((long)p + 0x28));
        p = *(void **)(curses->conflict_flags + lVar1 + -0x10);
      }
      mem_free(p);
    }
    mem_free(*(void **)(curses->conflict_flags + lVar1 + -0x18));
    lVar1 = lVar1 + 0x38;
  }
  mem_free(curses);
  return;
}

Assistant:

static void cleanup_curse(void)
{
	int idx;
	for (idx = 0; idx < z_info->curse_max; idx++) {
		string_free(curses[idx].name);
		string_free(curses[idx].conflict);
		mem_free(curses[idx].desc);
		if (curses[idx].obj) {
			free_effect(curses[idx].obj->effect);
			mem_free(curses[idx].obj->effect_msg);
			if (curses[idx].obj->known) {
				object_free(curses[idx].obj->known);
			}
			mem_free(curses[idx].obj);
		}
		mem_free(curses[idx].poss);
	}
	mem_free(curses);
}